

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_type_enum_value_pos(lysp_yang_ctx *ctx,ly_stmt val_kw,lysp_type_enum *enm)

{
  ulong uVar1;
  LY_ERR LVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  ulonglong uVar6;
  char *pcVar7;
  ly_ctx *plVar8;
  bool bVar9;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *ptr;
  char *buf;
  ly_stmt local_54;
  char *local_50;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  local_38 = (char *)0x0;
  if ((*(uint *)&enm->flags >> 9 & 1) == 0) {
    enm->flags = (ushort)*(uint *)&enm->flags | 0x200;
    LVar2 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_50,&local_38,&local_48);
    uVar1 = local_48;
    pcVar4 = local_50;
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    if ((((local_48 == 0) || (*local_50 == '+')) || (local_48 != 1 && *local_50 == '0')) ||
       ((val_kw == LY_STMT_POSITION && (iVar3 = strncmp(local_50,"-0",2), iVar3 == 0)))) {
LAB_00175fbc:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar4 = lyplg_ext_stmt2str(val_kw);
      pcVar7 = "Invalid value \"%.*s\" of \"%s\".";
    }
    else {
      piVar5 = __errno_location();
      *piVar5 = 0;
      if (val_kw == LY_STMT_VALUE) {
        uVar6 = strtoll(pcVar4,&local_40,10);
        if ((long)(int)uVar6 != uVar6) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar4 = lyplg_ext_stmt2str(LY_STMT_VALUE);
          pcVar7 = "Invalid value \"%.*s\" of \"%s\".";
          goto LAB_00176049;
        }
      }
      else {
        uVar6 = strtoull(pcVar4,&local_40,10);
        if (uVar6 >> 0x20 != 0) goto LAB_00175fbc;
      }
      if ((long)local_40 - (long)local_50 == uVar1) {
        if (*piVar5 != 0x22) {
          enm->value = uVar6;
          LVar2 = get_keyword(ctx,&local_54,&local_50,&local_48);
          if (LVar2 != LY_SUCCESS) goto LAB_00176055;
          if (local_54 == LY_STMT_SYNTAX_SEMICOLON) {
            bVar9 = true;
          }
          else {
            if (local_54 != LY_STMT_SYNTAX_LEFT_BRACE) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar8 = (ly_ctx *)0x0;
              }
              else {
                plVar8 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar4 = lyplg_ext_stmt2str(local_54);
              pcVar7 = "Invalid keyword \"%s\", expected \";\" or \"{\".";
              goto LAB_0017600c;
            }
            LVar2 = get_keyword(ctx,&local_54,&local_50,&local_48);
            if (LVar2 != LY_SUCCESS) goto LAB_00176055;
            bVar9 = local_54 == LY_STMT_SYNTAX_RIGHT_BRACE;
          }
          LVar2 = LY_SUCCESS;
          if (!bVar9) {
            do {
              if (local_54 != LY_STMT_EXTENSION_INSTANCE) {
                if (ctx == (lysp_yang_ctx *)0x0) {
                  plVar8 = (ly_ctx *)0x0;
                }
                else {
                  plVar8 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar4 = lyplg_ext_stmt2str(local_54);
                pcVar7 = lyplg_ext_stmt2str(val_kw);
                ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,pcVar7);
                goto LAB_00176050;
              }
              LVar2 = parse_ext(ctx,local_50,local_48,enm,val_kw,0,&enm->exts);
              if ((LVar2 != LY_SUCCESS) ||
                 (LVar2 = get_keyword(ctx,&local_54,&local_50,&local_48), LVar2 != LY_SUCCESS))
              break;
              if (local_54 == LY_STMT_SYNTAX_RIGHT_BRACE) {
                bVar9 = true;
              }
              LVar2 = LY_SUCCESS;
            } while (!bVar9);
          }
          goto LAB_00176055;
        }
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = lyplg_ext_stmt2str(val_kw);
        pcVar7 = "Value \"%.*s\" is out of \"%s\" bounds.";
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = lyplg_ext_stmt2str(val_kw);
        pcVar7 = "Invalid value \"%.*s\" of \"%s\".";
      }
    }
LAB_00176049:
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,pcVar7,uVar1 & 0xffffffff,local_50,pcVar4);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar4 = lyplg_ext_stmt2str(val_kw);
    pcVar7 = "Duplicate keyword \"%s\".";
LAB_0017600c:
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,pcVar7,pcVar4);
  }
LAB_00176050:
  LVar2 = LY_EVALID;
LAB_00176055:
  free(local_38);
  return LVar2;
}

Assistant:

LY_ERR
parse_type_enum_value_pos(struct lysp_yang_ctx *ctx, enum ly_stmt val_kw, struct lysp_type_enum *enm)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word, *ptr;
    size_t word_len;
    long long num = 0;
    unsigned long long unum = 0;
    enum ly_stmt kw;

    if (enm->flags & LYS_SET_VALUE) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(val_kw));
        ret = LY_EVALID;
        goto cleanup;
    }
    enm->flags |= LYS_SET_VALUE;

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    if (!word_len || (word[0] == '+') || ((word[0] == '0') && (word_len > 1)) || ((val_kw == LY_STMT_POSITION) && !strncmp(word, "-0", 2))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
        ret = LY_EVALID;
        goto cleanup;
    }

    errno = 0;
    if (val_kw == LY_STMT_VALUE) {
        num = strtoll(word, &ptr, LY_BASE_DEC);
        if ((num < INT64_C(-2147483648)) || (num > INT64_C(2147483647))) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
            ret = LY_EVALID;
            goto cleanup;
        }
    } else {
        unum = strtoull(word, &ptr, LY_BASE_DEC);
        if (unum > UINT64_C(4294967295)) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
            ret = LY_EVALID;
            goto cleanup;
        }
    }
    /* we have not parsed the whole argument */
    if ((size_t)(ptr - word) != word_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
        ret = LY_EVALID;
        goto cleanup;
    }
    if (errno == ERANGE) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
        ret = LY_EVALID;
        goto cleanup;
    }
    if (val_kw == LY_STMT_VALUE) {
        enm->value = num;
    } else {
        enm->value = unum;
    }

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            ret = parse_ext(ctx, word, word_len, enm, val_kw, 0, &enm->exts);
            LY_CHECK_GOTO(ret, cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(val_kw));
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}